

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interfaces.cpp
# Opt level: O2

void __thiscall
node::anon_unknown_2::NodeImpl::updateRwSetting(NodeImpl *this,string *name,SettingsValue *value)

{
  ArgsManager *pAVar1;
  mapped_type *this_00;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>_>
  *this_01;
  long in_FS_OFFSET;
  unique_lock<std::recursive_mutex> uStack_38;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  pAVar1 = args(this);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)&uStack_38,&pAVar1->cs_args,
             "cs_args",
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/common/args.h"
             ,0x19e,false);
  this_01 = &(pAVar1->m_settings).rw_settings;
  if (value->typ == VNULL) {
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>_>
    ::erase(&this_01->_M_t,name);
  }
  else {
    this_00 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>_>
              ::operator[](this_01,name);
    UniValue::operator=(this_00,value);
  }
  std::unique_lock<std::recursive_mutex>::~unique_lock(&uStack_38);
  pAVar1 = args(this);
  ArgsManager::WriteSettingsFile
            (pAVar1,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)0x0,false);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void updateRwSetting(const std::string& name, const common::SettingsValue& value) override
    {
        args().LockSettings([&](common::Settings& settings) {
            if (value.isNull()) {
                settings.rw_settings.erase(name);
            } else {
                settings.rw_settings[name] = value;
            }
        });
        args().WriteSettingsFile();
    }